

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O2

void __thiscall
OpenMD::HBondJumpR::HBondJumpR
          (HBondJumpR *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3
          ,RealType OOcut,RealType thetaCut,RealType OHcut,RealType len,int nRBins)

{
  SelectionEvaluator *this_00;
  long lVar1;
  uint i;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_58;
  string local_50;
  
  HBondJump::HBondJump(&this->super_HBondJump,info,filename,sele1,sele2,OOcut,thetaCut,OHcut);
  (this->super_HBondJump).super_TimeCorrFunc<double>.super_DynamicProperty._vptr_DynamicProperty =
       (_func_int **)&PTR__HBondJumpR_002b65e8;
  this->len_ = len;
  this->nRBins_ = nRBins;
  SelectionManager::SelectionManager
            (&this->seleMan3_,(this->super_HBondJump).super_TimeCorrFunc<double>.info_);
  std::__cxx11::string::string((string *)&this->selectionScript3_,(string *)sele3);
  this_00 = &this->evaluator3_;
  SelectionEvaluator::SelectionEvaluator
            (this_00,(this->super_HBondJump).super_TimeCorrFunc<double>.info_);
  (this->rbin_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rbin_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->counts_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->counts_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->counts_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rbin_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = &this->counts_;
  local_58 = &this->histogram_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"HBondJumpR",(allocator<char> *)&local_50);
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_HBondJump).super_TimeCorrFunc<double>.corrFuncType_);
  std::__cxx11::string::~string((string *)&local_80);
  getPrefix(&local_50,&(this->super_HBondJump).super_TimeCorrFunc<double>.dumpFilename_);
  std::operator+(&local_80,&local_50,".jumpR");
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_HBondJump).super_TimeCorrFunc<double>.super_DynamicProperty.
              outputFilename_);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->rbin_,(long)(this->super_HBondJump).super_TimeCorrFunc<double>.nFrames_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->histogram_,(ulong)(this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->counts_,(ulong)(this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_);
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < (this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_;
      uVar2 = uVar2 + 1) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->histogram_).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar1),(ulong)this->nRBins_);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(((this->counts_).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data + lVar1),(ulong)this->nRBins_);
    lVar1 = lVar1 + 0x18;
  }
  SelectionEvaluator::loadScriptString(this_00,&this->selectionScript3_);
  if ((this->evaluator3_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_80,this_00);
    SelectionManager::setSelectionSet(&this->seleMan3_,(SelectionSet *)&local_80);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_80);
  }
  this->deltaR_ = this->len_ / (double)this->nRBins_;
  return;
}

Assistant:

HBondJumpR::HBondJumpR(SimInfo* info, const std::string& filename,
                         const std::string& sele1, const std::string& sele2,
                         const std::string& sele3, RealType OOcut,
                         RealType thetaCut, RealType OHcut, RealType len,
                         int nRBins) :
      HBondJump(info, filename, sele1, sele2, OOcut, thetaCut, OHcut),
      len_(len), nRBins_(nRBins), seleMan3_(info_), selectionScript3_(sele3),
      evaluator3_(info_) {
    setCorrFuncType("HBondJumpR");
    setOutputName(getPrefix(dumpFilename_) + ".jumpR");

    rbin_.resize(nFrames_);
    histogram_.resize(nTimeBins_);
    counts_.resize(nTimeBins_);
    for (unsigned int i = 0; i < nTimeBins_; i++) {
      histogram_[i].resize(nRBins_);
      counts_[i].resize(nRBins_);
    }

    evaluator3_.loadScriptString(selectionScript3_);
    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    deltaR_ = len_ / nRBins_;
  }